

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_25::BinaryReader::ReadInitExpr(BinaryReader *this,Index index)

{
  bool bVar1;
  Result result;
  Index index_local;
  BinaryReader *this_local;
  
  result = ReadInstructions(this,this->read_end_,"init expression");
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (this->read_end_ < (this->state_).offset) {
      __assert_fail("state_.offset <= read_end_",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader.cc"
                    ,599,"Result wabt::(anonymous namespace)::BinaryReader::ReadInitExpr(Index)");
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadInitExpr(Index index) {
  CHECK_RESULT(ReadInstructions(read_end_, "init expression"));
  assert(state_.offset <= read_end_);
  return Result::Ok;
}